

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

int ggml::cpu::aarch64::repack<block_iq4_nl,4l,4l>(ggml_tensor *t,void *data,size_t data_size)

{
  undefined2 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined1 (*pauVar15) [64];
  undefined1 (*pauVar16) [64];
  int i;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  block_iq4_nlx4 out;
  block_iq4_nl dst_tmp [4];
  undefined8 local_c0;
  undefined1 auStack_b8 [56];
  undefined8 uStack_80;
  undefined8 local_78 [2];
  undefined2 auStack_68 [32];
  
  if (t->type == GGML_TYPE_IQ4_NL) {
    pauVar15 = (undefined1 (*) [64])t->data;
    puVar5 = (undefined8 *)ggml_nrows();
    uVar2 = t->ne[0];
    iVar4 = (int)puVar5;
    uVar9 = uVar2 + 0x1f;
    if (-1 < (long)uVar2) {
      uVar9 = uVar2;
    }
    iVar8 = (int)((long)uVar9 >> 5);
    if ((long)(iVar4 * iVar8) * 0x12 == data_size) {
      iVar11 = -1;
      if ((uVar2 & 7) == 0 && (t->ne[1] & 3U) == 0) {
        if (0 < iVar4) {
          puVar6 = (undefined8 *)(long)iVar8;
          iVar11 = 0;
          auVar20 = vpbroadcastq_avx512f();
          vpaddq_avx512f(auVar20,_DAT_0014b240);
          vpaddq_avx512f(auVar20,_DAT_0014b280);
          do {
            if (0 < (long)puVar6) {
              puVar13 = (undefined8 *)0x0;
              puVar12 = (undefined8 *)data;
              pauVar16 = pauVar15;
              do {
                lVar17 = 0;
                puVar14 = puVar12;
                do {
                  *(undefined2 *)((long)auStack_68 + lVar17) = *(undefined2 *)(puVar14 + 2);
                  uVar10 = *puVar14;
                  uVar3 = puVar14[1];
                  puVar14 = (undefined8 *)((long)puVar14 + (long)puVar6 * 0x12);
                  *(undefined8 *)((long)local_78 + lVar17) = uVar10;
                  *(undefined8 *)((long)local_78 + lVar17 + 8) = uVar3;
                  lVar17 = lVar17 + 0x12;
                } while (lVar17 != 0x48);
                lVar17 = 0;
                puVar14 = local_78;
                do {
                  uVar1 = *(undefined2 *)puVar14;
                  puVar14 = (undefined8 *)((long)puVar14 + 0x12);
                  *(undefined2 *)(auStack_b8 + lVar17 * 2 + -8) = uVar1;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 4);
                pauVar15 = (undefined1 (*) [64])(pauVar16[1] + 8);
                puVar13 = (undefined8 *)((long)puVar13 + 1);
                puVar12 = (undefined8 *)((long)puVar12 + 0x12);
                auVar18 = vpgatherqd_avx512f(*puVar5);
                auVar19 = vpgatherqd_avx512f(*puVar6);
                auVar20 = vinserti64x4_avx512f(ZEXT3264(auVar19),auVar18,1);
                auVar20 = vmovdqu64_avx512f(auVar20);
                auStack_b8 = auVar20._0_56_;
                uStack_80 = auVar20._56_8_;
                *(undefined8 *)pauVar16[1] = uStack_80;
                auVar20._8_56_ = auStack_b8;
                auVar20._0_8_ = local_c0;
                auVar20 = vmovdqu64_avx512f(auVar20);
                auVar20 = vmovdqu64_avx512f(auVar20);
                *pauVar16 = auVar20;
                pauVar16 = pauVar15;
              } while (puVar13 != puVar6);
            }
            iVar11 = iVar11 + 4;
            data = (void *)((long)data + (long)(iVar8 * 4) * 0x12);
          } while (iVar11 < iVar4);
        }
        iVar11 = 0;
      }
      return iVar11;
    }
    pcVar7 = "data_size == nrow * nblocks * sizeof(block_iq4_nl)";
    uVar10 = 0x172e;
  }
  else {
    pcVar7 = "t->type == GGML_TYPE_IQ4_NL";
    uVar10 = 0x1723;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar10,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

static int repack_iq4_nl_to_iq4_nl_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_IQ4_NL);
    //GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    GGML_ASSERT(interleave_block == 4);

    block_iq4_nlx4 * dst = (block_iq4_nlx4 *)t->data;
    const block_iq4_nl * src = (const block_iq4_nl *)data;
    block_iq4_nl dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nrows_interleaved = 4;
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_iq4_nl));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_iq4_nlx4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}